

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O0

void xLearn::read_from_memory(string *filename,int task_id)

{
  int iVar1;
  uint in_ESI;
  bool in_stack_0000001f;
  int record_num;
  int i;
  DMatrix *matrix;
  Reader *reader;
  InmemReader in_mem_reader;
  InmemReader *in_stack_fffffffffffffe50;
  int local_194;
  undefined8 local_190 [3];
  long *local_178;
  long local_170 [37];
  string *in_stack_ffffffffffffffb8;
  InmemReader *in_stack_ffffffffffffffc0;
  
  InmemReader::InmemReader((InmemReader *)local_170);
  local_178 = (long *)0x0;
  InmemReader::Initialize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_178 = local_170;
  local_190[0] = 0;
  for (local_194 = 0; local_194 < 10; local_194 = local_194 + 1) {
    iVar1 = (**(code **)(*local_178 + 0x20))(local_178,local_190);
    if (iVar1 == 0) {
      local_194 = local_194 + -1;
      (**(code **)(*local_178 + 0x28))();
    }
    else {
      in_stack_fffffffffffffe50 = (InmemReader *)(ulong)in_ESI;
      switch(in_stack_fffffffffffffe50) {
      case (InmemReader *)0x0:
        CheckLR((DMatrix *)
                in_mem_reader.super_Reader.data_samples_.Y.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start,in_mem_reader.super_Reader.data_samples_.row.
                         super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                in_mem_reader.super_Reader.data_samples_.row.
                super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_);
        break;
      case (InmemReader *)0x1:
        CheckFFM((DMatrix *)
                 in_mem_reader.super_Reader.data_samples_.Y.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start,in_mem_reader.super_Reader.data_samples_.row.
                          super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                 in_mem_reader.super_Reader.data_samples_.row.
                 super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_);
        break;
      case (InmemReader *)0x2:
        CheckCSV(_record_num,in_stack_0000001f);
        break;
      case (InmemReader *)0x3:
        CheckLR((DMatrix *)
                in_mem_reader.super_Reader.data_samples_.Y.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start,in_mem_reader.super_Reader.data_samples_.row.
                         super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                in_mem_reader.super_Reader.data_samples_.row.
                super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_);
        break;
      case (InmemReader *)0x4:
        CheckFFM((DMatrix *)
                 in_mem_reader.super_Reader.data_samples_.Y.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start,in_mem_reader.super_Reader.data_samples_.row.
                          super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                 in_mem_reader.super_Reader.data_samples_.row.
                 super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_);
      }
    }
  }
  InmemReader::~InmemReader(in_stack_fffffffffffffe50);
  return;
}

Assistant:

void read_from_memory(const std::string& filename, int task_id) {
  InmemReader in_mem_reader;
  Reader* reader = nullptr;
  in_mem_reader.Initialize(filename);
  reader = &in_mem_reader;
  DMatrix* matrix = nullptr;
  for (int i = 0; i < iteration_num; ++i) {
    int record_num = reader->Samples(matrix);
    if (record_num == 0) {
      --i;
      reader->Reset();
      continue;
    }
    switch (task_id) {
      case 0:
        CheckLR(matrix, true, false);
        break;
      case 1:
        CheckFFM(matrix, true, false);
        break;
      case 2:
        CheckCSV(matrix, false);
        break;
      case 3:
        CheckLR(matrix, false, false);
        break;
      case 4:
        CheckFFM(matrix, false, false);
        break;
    }
  }
}